

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void get_range<float,long>
               (size_t col_num,size_t nrows,float *Xc,long *Xc_ind,long *Xc_indptr,
               MissingAction missing_action,double *xmin,double *xmax,bool *unsplittable)

{
  long lVar1;
  double dVar2;
  bool bVar3;
  long ix;
  long lVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  ulong uVar11;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  lVar4 = Xc_indptr[col_num];
  lVar1 = Xc_indptr[col_num + 1];
  if ((ulong)(lVar1 - lVar4) < nrows) {
    *xmin = 0.0;
    *xmax = 0.0;
  }
  if (missing_action == Fail) {
    if (lVar4 < lVar1) {
      dVar6 = *xmin;
      dVar10 = *xmax;
      do {
        dVar7 = (double)Xc[lVar4];
        dVar2 = dVar7;
        if (dVar6 <= dVar7) {
          dVar2 = dVar6;
        }
        if (dVar7 <= dVar10) {
          dVar7 = dVar10;
        }
        lVar4 = lVar4 + 1;
        dVar6 = dVar2;
        dVar10 = dVar7;
      } while (lVar1 != lVar4);
      *xmin = dVar2;
      *xmax = dVar7;
    }
  }
  else if (lVar4 < lVar1) {
    uVar8 = SUB84(*xmax,0);
    uVar9 = (undefined4)((ulong)*xmax >> 0x20);
    dVar6 = *xmin;
    do {
      if (ABS(Xc[lVar4]) != INFINITY) {
        dVar10 = (double)Xc[lVar4];
        dVar2 = dVar10;
        if (dVar6 <= dVar10) {
          dVar2 = dVar6;
        }
        dVar6 = (double)(~-(ulong)NAN(dVar6) & (ulong)dVar2 | -(ulong)NAN(dVar6) & (ulong)dVar10);
        *xmin = dVar6;
        uVar5 = -(ulong)(NAN((double)CONCAT44(uVar9,uVar8)) || NAN((double)CONCAT44(uVar9,uVar8)));
        uVar11 = uVar5 & (ulong)dVar10;
        if (dVar10 <= (double)CONCAT44(uVar9,uVar8)) {
          dVar10 = (double)CONCAT44(uVar9,uVar8);
        }
        dVar10 = (double)(~uVar5 & (ulong)dVar10 | uVar11);
        *xmax = dVar10;
        uVar8 = SUB84(dVar10,0);
        uVar9 = (undefined4)((ulong)dVar10 >> 0x20);
      }
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  dVar6 = *xmin;
  dVar10 = *xmax;
  bVar3 = true;
  if (((dVar6 != dVar10) || (NAN(dVar6) || NAN(dVar10))) &&
     (dVar6 != INFINITY || dVar10 != -INFINITY)) {
    bVar3 = NAN(dVar10);
  }
  *unsplittable = bVar3;
  return;
}

Assistant:

void get_range(size_t col_num, size_t nrows,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    if ((size_t)(Xc_indptr[col_num+1] - Xc_indptr[col_num]) < nrows)
    {
        xmin = 0;
        xmax = 0;
    }

    if (missing_action == Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xmin = (Xc[ix] < xmin)? Xc[ix] : xmin;
            xmax = (Xc[ix] > xmax)? Xc[ix] : xmax;
        }
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            if (unlikely(std::isinf(Xc[ix]))) continue;
            xmin = std::fmin(xmin, Xc[ix]);
            xmax = std::fmax(xmax, Xc[ix]);
        }
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}